

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

void __thiscall GlobalMemoryAccountant::restoreMemoryAllocators(GlobalMemoryAccountant *this)

{
  AccountingTestMemoryAllocator *pAVar1;
  TestMemoryAllocator *pTVar2;
  GlobalMemoryAccountant *this_local;
  
  pAVar1 = (AccountingTestMemoryAllocator *)getCurrentMallocAllocator();
  if (pAVar1 == this->mallocAllocator_) {
    pTVar2 = AccountingTestMemoryAllocator::originalAllocator(this->mallocAllocator_);
    setCurrentMallocAllocator(pTVar2);
  }
  pAVar1 = (AccountingTestMemoryAllocator *)getCurrentNewAllocator();
  if (pAVar1 == this->newAllocator_) {
    pTVar2 = AccountingTestMemoryAllocator::originalAllocator(this->newAllocator_);
    setCurrentNewAllocator(pTVar2);
  }
  pAVar1 = (AccountingTestMemoryAllocator *)getCurrentNewArrayAllocator();
  if (pAVar1 == this->newArrayAllocator_) {
    pTVar2 = AccountingTestMemoryAllocator::originalAllocator(this->newArrayAllocator_);
    setCurrentNewArrayAllocator(pTVar2);
  }
  return;
}

Assistant:

void GlobalMemoryAccountant::restoreMemoryAllocators()
{
    if (getCurrentMallocAllocator() == mallocAllocator_)
        setCurrentMallocAllocator(mallocAllocator_->originalAllocator());

    if (getCurrentNewAllocator() == newAllocator_)
        setCurrentNewAllocator(newAllocator_->originalAllocator());

    if (getCurrentNewArrayAllocator() == newArrayAllocator_)
        setCurrentNewArrayAllocator(newArrayAllocator_->originalAllocator());
}